

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mul.h
# Opt level: O2

LinTerms * __thiscall
mp::
QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_0>
::LinearizeProductWithBinaryVar
          (LinTerms *__return_storage_ptr__,
          QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_0>
          *this,double c,int x,int y)

{
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  int iVar1;
  bool bVar2;
  Var v;
  Error *this_01;
  NodeRange NVar3;
  CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>
  local_60;
  
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.
             m_data.m_storage;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data
             .m_storage;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  bVar2 = FlatModel<mp::DefaultFlatModelParams>::is_binary_var
                    ((FlatModel<mp::DefaultFlatModelParams> *)
                     (this->
                     super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                     ).mdl_cvt_,x);
  if ((!bVar2) &&
     (bVar2 = FlatModel<mp::DefaultFlatModelParams>::is_binary_var
                        ((FlatModel<mp::DefaultFlatModelParams> *)
                         (this->
                         super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                         ).mdl_cvt_,y), !bVar2)) {
    this_01 = (Error *)__cxa_allocate_exception(0x18);
    Error::Error(this_01,(CStringRef)0x2aeec4,-1);
    __cxa_throw(this_01,&Error::typeinfo,fmt::SystemError::~SystemError);
  }
  bVar2 = FlatModel<mp::DefaultFlatModelParams>::is_binary_var
                    ((FlatModel<mp::DefaultFlatModelParams> *)
                     (this->
                     super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                     ).mdl_cvt_,x);
  this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)(this->
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).mdl_cvt_;
  NVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::MakeFixedVar(this_00,0.0);
  iVar1 = y;
  if (bVar2) {
    iVar1 = x;
    x = y;
  }
  local_60.super_CustomConstraintData<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::IfThenId>.
  args_._M_elems[1] = x;
  local_60.super_CustomConstraintData<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::IfThenId>.
  args_._M_elems[0] = iVar1;
  local_60.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
       (pointer)&local_60.super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
  local_60.super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length = 0;
  local_60.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
  local_60.super_FunctionalConstraint.result_var_ = -1;
  local_60.super_FunctionalConstraint.ctx.value_ = CTX_NONE;
  local_60.super_CustomConstraintData<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::IfThenId>.
  args_._M_elems[2] = NVar3.ir_.beg_;
  v = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
      ::
      AssignResultVar2Args<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::IfThenId>>
                ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                  *)this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  LinTerms::add_term(__return_storage_ptr__,c,v);
  return __return_storage_ptr__;
}

Assistant:

LinTerms LinearizeProductWithBinaryVar(double c, int x, int y) {
    LinTerms lt;
    MP_ASSERT_ALWAYS(GetMC().is_binary_var(x) ||
                     GetMC().is_binary_var(y),
                     "Can only convert product with a binary variable");
    bool is_x_bin = GetMC().is_binary_var(x);
    auto i_bin = is_x_bin ? x : y;       // index of the (chosen) binary var
    auto i_other = is_x_bin ? y : x;                  // the other var index
    auto x_ifthen = GetMC().AssignResultVar2Args(
          IfThenConstraint {{      // no context as of now
                                   i_bin,
                                   i_other,
                                   int( GetMC().MakeFixedVar(0.0) )
                            }} );
    lt.add_term(c, x_ifthen);
    return lt;
  }